

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Chapters::Atom::Parse(Atom *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  longlong lVar4;
  long stop;
  longlong pos_local;
  longlong val;
  longlong size_1;
  longlong id;
  
  stop = size + pos;
  pos_local = pos;
  do {
    do {
      if (stop <= pos_local) {
        return (ulong)(pos_local == stop) * 2 + -2;
      }
      lVar3 = ParseElementHeader(pReader,&pos_local,stop,&id,&size_1);
      lVar2 = size_1;
      lVar1 = pos_local;
      if (lVar3 < 0) {
        return lVar3;
      }
    } while (size_1 == 0);
    if (id == 0x80) {
      lVar3 = ParseDisplay(this,pReader,pos_local,size_1);
LAB_00153fe7:
      if (lVar3 < 0) {
        return lVar3;
      }
    }
    else if (id == 0x91) {
      lVar4 = UnserializeUInt(pReader,pos_local,size_1);
      if (lVar4 < 0) {
        return lVar4;
      }
      this->m_start_timecode = lVar4;
    }
    else if (id == 0x92) {
      lVar4 = UnserializeUInt(pReader,pos_local,size_1);
      if (lVar4 < 0) {
        return lVar4;
      }
      this->m_stop_timecode = lVar4;
    }
    else {
      if (id == 0x5654) {
        lVar3 = UnserializeString(pReader,pos_local,size_1,&this->m_string_uid);
        goto LAB_00153fe7;
      }
      if (id == 0x73c4) {
        lVar3 = UnserializeInt(pReader,pos_local,size_1,&val);
        if (lVar3 < 0) {
          return lVar3;
        }
        this->m_uid = val;
      }
    }
    pos_local = lVar1 + lVar2;
    if (stop < pos_local) {
      return -2;
    }
  } while( true );
}

Assistant:

long Chapters::Atom::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // 0 length payload, skip.
      continue;

    if (id == libwebm::kMkvChapterDisplay) {
      status = ParseDisplay(pReader, pos, size);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterStringUID) {
      status = UnserializeString(pReader, pos, size, m_string_uid);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterUID) {
      long long val;
      status = UnserializeInt(pReader, pos, size, val);

      if (status < 0)  // error
        return status;

      m_uid = static_cast<unsigned long long>(val);
    } else if (id == libwebm::kMkvChapterTimeStart) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_start_timecode = val;
    } else if (id == libwebm::kMkvChapterTimeEnd) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_stop_timecode = val;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}